

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ExclusiveBetweenOperator,false,true,false>
                (hugeint_t *adata,hugeint_t *bdata,hugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  idx_t row_idx;
  idx_t i;
  idx_t iVar5;
  idx_t row_idx_00;
  idx_t iVar6;
  idx_t iVar7;
  idx_t row_idx_01;
  
  iVar5 = 0;
  iVar6 = 0;
  do {
    if (count == iVar5) {
      return iVar6;
    }
    iVar7 = iVar5;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)result_sel->sel_vector[iVar5];
    }
    row_idx_01 = iVar5;
    if (asel->sel_vector != (sel_t *)0x0) {
      row_idx_01 = (idx_t)asel->sel_vector[iVar5];
    }
    row_idx = iVar5;
    if (bsel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)bsel->sel_vector[iVar5];
    }
    row_idx_00 = iVar5;
    if (csel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (idx_t)csel->sel_vector[iVar5];
    }
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
    if (bVar3) {
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (!bVar3) goto LAB_013a8211;
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (!bVar3) goto LAB_013a8211;
      lVar1 = adata[row_idx_01].upper;
      if ((lVar1 <= bdata[row_idx].upper) &&
         (adata[row_idx_01].lower <= bdata[row_idx].lower || lVar1 != bdata[row_idx].upper))
      goto LAB_013a8211;
      lVar2 = cdata[row_idx_00].upper;
      uVar4 = (ulong)(adata[row_idx_01].lower < cdata[row_idx_00].lower && lVar2 == lVar1 ||
                     lVar2 != lVar1 && lVar1 <= lVar2);
    }
    else {
LAB_013a8211:
      uVar4 = 0;
    }
    true_sel->sel_vector[iVar6] = (sel_t)iVar7;
    iVar6 = iVar6 + uVar4;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}